

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Agent.cpp
# Opt level: O0

void __thiscall RVO::Agent::computeNeighbors(Agent *this)

{
  Agent *this_local;
  
  std::vector<const_RVO::Obstacle_*,_std::allocator<const_RVO::Obstacle_*>_>::clear
            (&this->obstacleNeighbors_);
  KdTree::computeObstacleNeighbors
            (this->sim_->kdTree_,this,this->neighborObstDist_ * this->neighborObstDist_);
  std::
  vector<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
  ::clear(&this->agentNeighbors_);
  if (this->maxNeighbors_ != 0) {
    KdTree::computeAgentNeighbors
              (this->sim_->kdTree_,this,this->neighborDist_ * this->neighborDist_);
  }
  return;
}

Assistant:

void Agent::computeNeighbors()
	{
		obstacleNeighbors_.clear();
		sim_->kdTree_->computeObstacleNeighbors(this, neighborObstDist_ * neighborObstDist_);

		agentNeighbors_.clear();

		if (maxNeighbors_ > 0) {
			sim_->kdTree_->computeAgentNeighbors(this, neighborDist_ * neighborDist_);
		}
	}